

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:56:51)>
::getImpl(SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:56:51)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<unsigned_long> depResult;
  ExceptionOr<unsigned_long> local_360;
  NullableValue<kj::Exception> local_1b8;
  char local_20;
  size_t local_18;
  
  local_1b8.isSet = false;
  local_20 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_1b8);
  if (local_1b8.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_360,&local_1b8.field_1.value);
    local_360.value.ptr.isSet = false;
    ExceptionOr<unsigned_long>::operator=((ExceptionOr<unsigned_long> *)output,&local_360);
  }
  else {
    if (local_20 != '\x01') goto LAB_0036d17d;
    local_360.value.ptr.field_1.value =
         anon_class_16_2_928cd080_for_func::operator()(&this->func,local_18);
    local_360.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_360.value.ptr.isSet = true;
    ExceptionOr<unsigned_long>::operator=((ExceptionOr<unsigned_long> *)output,&local_360);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_360);
LAB_0036d17d:
  NullableValue<kj::Exception>::~NullableValue(&local_1b8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }